

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O2

int __thiscall
Saturation::ManCSPassiveClauseContainer::remove(ManCSPassiveClauseContainer *this,char *__filename)

{
  int extraout_EAX;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  __position;
  Clause *local_20;
  
  local_20 = (Clause *)__filename;
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<Kernel::Clause**,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>,__gnu_cxx::__ops::_Iter_equals_val<Kernel::Clause*const>>
                         ((this->clauses).
                          super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (this->clauses).
                          super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&local_20);
  std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::erase
            (&this->clauses,(const_iterator)__position._M_current);
  Lib::SingleParamEvent<Kernel::Clause_*>::fire
            (&(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
              super_ClauseContainer.removedEvent,local_20);
  return extraout_EAX;
}

Assistant:

void ManCSPassiveClauseContainer::remove(Clause* cl)
{
  ASS(cl->store()==Clause::PASSIVE);

  auto it = std::find(clauses.begin(),clauses.end(),cl);
  ASS(it != clauses.end());
  clauses.erase(it);

  removedEvent.fire(cl);
  ASS(cl->store()!=Clause::PASSIVE);
}